

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_OffsetSurfaceValue>::Append
          (ON_SimpleArray<ON_OffsetSurfaceValue> *this,ON_OffsetSurfaceValue *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  int iVar5;
  ON_OffsetSurfaceValue *pOVar6;
  ON_OffsetSurfaceValue *pOVar7;
  
  iVar5 = this->m_count;
  pOVar6 = x;
  if (iVar5 == this->m_capacity) {
    iVar5 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar6 = (ON_OffsetSurfaceValue *)onmalloc(0x28);
      dVar1 = x->m_t;
      dVar2 = x->m_distance;
      dVar3 = x->m_radius;
      pOVar6->m_s = x->m_s;
      pOVar6->m_t = dVar1;
      pOVar6->m_distance = dVar2;
      pOVar6->m_radius = dVar3;
      uVar4 = *(undefined4 *)&x->field_0x24;
      pOVar6->m_index = x->m_index;
      *(undefined4 *)&pOVar6->field_0x24 = uVar4;
    }
    Reserve(this,(long)iVar5);
    pOVar7 = this->m_a;
    if (pOVar7 == (ON_OffsetSurfaceValue *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar5 = this->m_count;
  }
  else {
    pOVar7 = this->m_a;
  }
  this->m_count = iVar5 + 1;
  pOVar7[iVar5].m_index = pOVar6->m_index;
  dVar1 = pOVar6->m_s;
  dVar2 = pOVar6->m_t;
  dVar3 = pOVar6->m_radius;
  pOVar7[iVar5].m_distance = pOVar6->m_distance;
  (&pOVar7[iVar5].m_distance)[1] = dVar3;
  pOVar7[iVar5].m_s = dVar1;
  pOVar7[iVar5].m_t = dVar2;
  if (pOVar6 != x) {
    onfree(pOVar6);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}